

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

vector<duckdb::BlockPointer,_true> * __thiscall
duckdb::Deserializer::ReadPropertyWithExplicitDefault<duckdb::vector<duckdb::BlockPointer,true>>
          (vector<duckdb::BlockPointer,_true> *__return_storage_ptr__,Deserializer *this,
          field_id_t field_id,char *tag,vector<duckdb::BlockPointer,_true> *default_value)

{
  pointer pBVar1;
  int iVar2;
  undefined6 in_register_00000012;
  
  iVar2 = (*this->_vptr_Deserializer[4])
                    (this,CONCAT62(in_register_00000012,field_id) & 0xffffffff,tag);
  if ((char)iVar2 == '\0') {
    (*this->_vptr_Deserializer[5])(this,0);
    pBVar1 = (default_value->
             super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
             super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl
             .super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_start =
         (default_value->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
         super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar1;
    (__return_storage_ptr__->
    super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (default_value->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
         super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (default_value->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (default_value->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (default_value->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    Read<duckdb::vector<duckdb::BlockPointer,true>>(__return_storage_ptr__,this);
    (*this->_vptr_Deserializer[5])(this,1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline T ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(default_value);
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}